

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleEndif(cmFortranParser *parser)

{
  bool bVar1;
  cmFortranParser *parser_local;
  
  bVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::empty(&parser->SkipToEnd);
  if (!bVar1) {
    std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop(&parser->SkipToEnd);
  }
  if (parser->InPPFalseBranch != 0) {
    parser->InPPFalseBranch = parser->InPPFalseBranch - 1;
  }
  return;
}

Assistant:

void cmFortranParser_RuleEndif(cmFortranParser* parser)
{
  if(!parser->SkipToEnd.empty())
    {
    parser->SkipToEnd.pop();
    }

  // #endif doesn't know if there was a "#else" in before, so it
  // always decreases InPPFalseBranch
  if(parser->InPPFalseBranch)
    {
    parser->InPPFalseBranch--;
    }
}